

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  int iVar1;
  LogMessageData *pLVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  LogMessage *this_00;
  int i;
  byte bVar9;
  char w [66];
  
  bVar9 = 0;
  if (SendToLog()::already_warned_before_initgoogle == '\0') {
    bVar4 = glog_internal_namespace_::IsGoogleLoggingInitialized();
    if (!bVar4) {
      pcVar7 = "WARNING: Logging before InitGoogleLogging() is written to STDERR\n";
      pcVar8 = w;
      for (lVar6 = 0x42; lVar6 != 0; lVar6 = lVar6 + -1) {
        *pcVar8 = *pcVar7;
        pcVar7 = pcVar7 + (ulong)bVar9 * -2 + 1;
        pcVar8 = pcVar8 + (ulong)bVar9 * -2 + 1;
      }
      WriteToStderr(w,0x41);
      SendToLog()::already_warned_before_initgoogle = '\x01';
    }
  }
  if (fLB::FLAGS_logtostderr == '\0') {
    bVar4 = glog_internal_namespace_::IsGoogleLoggingInitialized();
    if (bVar4) {
      pLVar2 = this->data_;
      LogDestination::LogToAllLogfiles
                ((int)pLVar2->severity_,pLVar2->timestamp_,pLVar2->message_text_,
                 pLVar2->num_chars_to_log_);
      pLVar2 = this->data_;
      LogDestination::MaybeLogToStderr
                ((int)pLVar2->severity_,pLVar2->message_text_,pLVar2->num_chars_to_log_);
      pLVar2 = this->data_;
      LogDestination::MaybeLogToEmail
                ((int)pLVar2->severity_,pLVar2->message_text_,pLVar2->num_chars_to_log_);
      goto LAB_00111c0b;
    }
  }
  pLVar2 = this->data_;
  ColoredWriteToStderr((int)pLVar2->severity_,pLVar2->message_text_,pLVar2->num_chars_to_log_);
LAB_00111c0b:
  pLVar2 = this->data_;
  this_00 = (LogMessage *)(ulong)(uint)(int)pLVar2->severity_;
  LogDestination::LogToSinks
            ((int)pLVar2->severity_,pLVar2->fullname_,pLVar2->basename_,pLVar2->line_,
             &pLVar2->tm_time_,pLVar2->message_text_ + pLVar2->num_prefix_chars_,
             ~pLVar2->num_prefix_chars_ + pLVar2->num_chars_to_log_,pLVar2->usecs_);
  if ((this->data_->severity_ == '\x03') && (exit_on_dfatal == '\x01')) {
    if (this->data_->first_fatal_ == true) {
      RecordCrashReason(this_00,(CrashReason *)crash_reason);
      glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
      iVar1 = (int)this->data_->num_chars_to_log_;
      iVar5 = 0xff;
      if (iVar1 < 0xff) {
        iVar5 = iVar1;
      }
      memcpy(&fatal_message,this->data_->message_text_,(long)iVar5);
      (&fatal_message)[iVar5] = 0;
      fatal_time = this->data_->timestamp_;
    }
    if (fLB::FLAGS_logtostderr == '\0') goto LAB_00111d18;
    do {
      ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
      LogDestination::WaitForSinks(this->data_);
      write(2,"*** Check failure stack trace: ***\n",0x23);
      (*(code *)g_logging_fail_func)();
LAB_00111d18:
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        if ((&LogDestination::log_destinations_)[lVar6] != 0) {
          plVar3 = *(long **)((&LogDestination::log_destinations_)[lVar6] + 0xd8);
          (**(code **)(*plVar3 + 0x10))(plVar3,1,0,"",0);
        }
      }
    } while( true );
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  log_mutex.AssertHeld();

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
             data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] = "WARNING: Logging before InitGoogleLogging() is "
                     "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || !IsGoogleLoggingInitialized()) {
    ColoredWriteToStderr(data_->severity_,
                         data_->message_text_, data_->num_chars_to_log_);

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_ -
                                data_->num_prefix_chars_ - 1),
                               data_->usecs_);
  } else {

    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, data_->timestamp_,
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_
                                - data_->num_prefix_chars_ - 1),
                               data_->usecs_);
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const int copy = min<int>(data_->num_chars_to_log_,
                                sizeof(fatal_message)-1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = data_->timestamp_;
    }

    if (!FLAGS_logtostderr) {
      for (int i = 0; i < NUM_SEVERITIES; ++i) {
        if ( LogDestination::log_destinations_[i] )
          LogDestination::log_destinations_[i]->logger_->Write(true, 0, "", 0);
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.Unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    Fail();
  }
}